

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_create(void *hint,nn_sockbase **sockbase)

{
  nn_req *self_00;
  nn_req *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_req *)nn_alloc_(0x540);
  if (self_00 == (nn_req *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/req.c"
            ,0x283);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_req_init(self_00,&nn_req_sockbase_vfptr,hint);
  *sockbase = (nn_sockbase *)self_00;
  return 0;
}

Assistant:

static int nn_req_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_req *self;

    self = nn_alloc (sizeof (struct nn_req), "socket (req)");
    alloc_assert (self);
    nn_req_init (self, &nn_req_sockbase_vfptr, hint);
    *sockbase = &self->xreq.sockbase;

    return 0;
}